

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  uint uVar3;
  uint uVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong uVar28;
  QuadMesh *mesh;
  size_t sVar29;
  NodeRef root;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  float *vertices1;
  ulong uVar33;
  ulong uVar34;
  vuint<4> *v;
  long lVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  ulong uVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  bool bVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar49;
  float fVar50;
  undefined1 in_ZMM0 [64];
  float fVar51;
  float fVar52;
  float fVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar76;
  float fVar82;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar83;
  float fVar84;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  float fVar75;
  float fVar79;
  undefined1 auVar74 [64];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar109;
  vint4 ai_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar132;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar136;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar133;
  float fVar135;
  float fVar137;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar138;
  float fVar139;
  float fVar160;
  float fVar162;
  float fVar164;
  vint4 bi_3;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar165;
  undefined1 auVar148 [16];
  float fVar161;
  float fVar163;
  float fVar166;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar167;
  float fVar181;
  float fVar182;
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar184;
  float fVar195;
  float fVar196;
  vint4 bi_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  float fVar203;
  float fVar204;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar217;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar218;
  float fVar219;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar235;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar236;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar237;
  float fVar241;
  float fVar242;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  vint4 ai;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar247;
  float fVar249;
  float fVar250;
  vint4 ai_1;
  undefined1 auVar248 [16];
  float fVar251;
  vint4 ai_3;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar255;
  float fVar257;
  float fVar258;
  undefined1 auVar256 [16];
  float fVar259;
  vuint<4> *v_1;
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  undefined1 local_1a98 [8];
  float fStack_1a90;
  float fStack_1a8c;
  Precalculations pre;
  undefined1 local_1a68 [8];
  float fStack_1a60;
  float fStack_1a5c;
  undefined1 local_1a58 [16];
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_18e8 [8];
  float fStack_18e0;
  float fStack_18dc;
  undefined1 local_18d8 [8];
  float fStack_18d0;
  float fStack_18cc;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar9 = mm_lookupmask_ps._240_16_;
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar48 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar55 = vpcmpeqd_avx(auVar48,(undefined1  [16])valid_i->field_0);
    auVar120 = ZEXT816(0) << 0x40;
    auVar73 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar120,5);
    auVar140 = auVar55 & auVar73;
    if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar140 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar140 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar140[0xf] < '\0'
       ) {
      auVar73 = vandps_avx(auVar73,auVar55);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar208._8_4_ = 0x7fffffff;
      auVar208._0_8_ = 0x7fffffff7fffffff;
      auVar208._12_4_ = 0x7fffffff;
      auVar55 = vandps_avx(auVar208,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar220._8_4_ = 0x219392ef;
      auVar220._0_8_ = 0x219392ef219392ef;
      auVar220._12_4_ = 0x219392ef;
      auVar140 = vcmpps_avx(auVar55,auVar220,1);
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = &DAT_3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar168 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar55 = vandps_avx(auVar208,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar141 = vcmpps_avx(auVar55,auVar220,1);
      auVar185 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar55 = vandps_avx(auVar208,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar55 = vcmpps_avx(auVar55,auVar220,1);
      auVar121 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar221._8_4_ = 0x5d5e0b6b;
      auVar221._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar221._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar168,auVar221,auVar140);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar185,auVar221,auVar141);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar121,auVar221,auVar55)
      ;
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar120,1);
      auVar185._8_4_ = 0x10;
      auVar185._0_8_ = 0x1000000010;
      auVar185._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar55,auVar185);
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar120,5);
      auVar140._8_4_ = 0x20;
      auVar140._0_8_ = 0x2000000020;
      auVar140._12_4_ = 0x20;
      auVar121._8_4_ = 0x30;
      auVar121._0_8_ = 0x3000000030;
      auVar121._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar121,auVar140,auVar55);
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar120,5);
      auVar141._8_4_ = 0x40;
      auVar141._0_8_ = 0x4000000040;
      auVar141._12_4_ = 0x40;
      auVar168._8_4_ = 0x50;
      auVar168._0_8_ = 0x5000000050;
      auVar168._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar168,auVar141,auVar55);
      auVar55 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar120);
      auVar140 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar120);
      auVar120._8_4_ = 0x7f800000;
      auVar120._0_8_ = 0x7f8000007f800000;
      auVar120._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar120,auVar55,auVar73);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar140,auVar73);
      terminated.field_0.i[1] = auVar73._4_4_ ^ auVar48._4_4_;
      terminated.field_0.i[0] = auVar73._0_4_ ^ auVar48._0_4_;
      terminated.field_0.i[2] = auVar73._8_4_ ^ auVar48._8_4_;
      terminated.field_0.i[3] = auVar73._12_4_ ^ auVar48._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar36 = paVar36 + -1;
        root.ptr = pNVar39[-1].ptr;
        pNVar39 = pNVar39 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0032b0ab:
          iVar24 = 3;
        }
        else {
          aVar54 = *paVar36;
          auVar48 = vcmpps_avx((undefined1  [16])aVar54,(undefined1  [16])tray.tfar.field_0,1);
          uVar23 = vmovmskps_avx(auVar48);
          if (uVar23 == 0) {
LAB_0032b0bc:
            iVar24 = 2;
          }
          else {
            uVar38 = (ulong)(uVar23 & 0xff);
            uVar23 = POPCOUNT(uVar23 & 0xff);
            iVar24 = 0;
            if (uVar23 <= uVar30) {
              do {
                sVar29 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> sVar29 & 1) == 0; sVar29 = sVar29 + 1) {
                  }
                }
                bVar40 = occluded1(This,bvh,root,sVar29,&pre,ray,&tray,context);
                if (bVar40) {
                  terminated.field_0.i[sVar29] = -1;
                }
                uVar38 = uVar38 & uVar38 - 1;
              } while (uVar38 != 0);
              auVar48 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar24 = 3;
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                auVar48._8_4_ = 0xff800000;
                auVar48._0_8_ = 0xff800000ff800000;
                auVar48._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                                   (undefined1  [16])terminated.field_0);
                iVar24 = 2;
              }
            }
            auVar74 = ZEXT1664((undefined1  [16])aVar54);
            if (uVar30 < uVar23) {
              do {
                uVar23 = (uint)root.ptr;
                auVar48 = auVar74._0_16_;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0032b0ab;
                  auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar48,6);
                  if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar55[0xf] < '\0') {
                    uVar38 = (ulong)(uVar23 & 0xf);
                    if (uVar38 == 8) {
                      auVar55 = vpcmpeqd_avx(auVar48,auVar48);
                      aVar49 = terminated.field_0;
                    }
                    else {
                      auVar146._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      auVar146._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      auVar146._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar25 = 0;
                      do {
                        lVar35 = uVar25 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar27 = vmovmskps_avx(auVar146);
                        uVar26 = CONCAT44((int)(uVar25 >> 0x20),uVar27);
                        uVar37 = 0;
                        local_1a58 = auVar146;
                        while (uVar23 = *(uint *)(lVar35 + 0x50 + uVar37 * 4), uVar23 != 0xffffffff)
                        {
                          uVar4 = *(uint *)(lVar35 + 0x40 + uVar37 * 4);
                          pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                          fVar41 = (pGVar6->time_range).lower;
                          auVar42._4_4_ = fVar41;
                          auVar42._0_4_ = fVar41;
                          auVar42._8_4_ = fVar41;
                          auVar42._12_4_ = fVar41;
                          fVar50 = pGVar6->fnumTimeSegments;
                          auVar55 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar42);
                          auVar48 = ZEXT416((uint)((pGVar6->time_range).upper - fVar41));
                          auVar48 = vshufps_avx(auVar48,auVar48,0);
                          auVar48 = vdivps_avx(auVar55,auVar48);
                          auVar43._0_4_ = fVar50 * auVar48._0_4_;
                          auVar43._4_4_ = fVar50 * auVar48._4_4_;
                          auVar43._8_4_ = fVar50 * auVar48._8_4_;
                          auVar43._12_4_ = fVar50 * auVar48._12_4_;
                          auVar48 = vroundps_avx(auVar43,1);
                          auVar55 = vshufps_avx(ZEXT416((uint)(fVar50 + -1.0)),
                                                ZEXT416((uint)(fVar50 + -1.0)),0);
                          auVar48 = vminps_avx(auVar48,auVar55);
                          auVar48 = vmaxps_avx(auVar48,ZEXT816(0) << 0x20);
                          auVar55 = vsubps_avx(auVar43,auVar48);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar48);
                          uVar28 = 0;
                          if (uVar26 != 0) {
                            for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          auVar48 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[uVar28]),0);
                          auVar48 = vpcmpeqd_avx(auVar48,(undefined1  [16])itime.field_0);
                          auVar48 = auVar146 & ~auVar48;
                          fVar50 = auVar55._4_4_;
                          fVar51 = auVar55._8_4_;
                          fVar75 = auVar55._12_4_;
                          fVar41 = auVar55._0_4_;
                          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar48 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar48[0xf]) {
                            lVar31 = (long)itime.field_0.i[uVar28] * 0x38;
                            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar31);
                            lVar31 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar31);
                            uVar28 = (ulong)*(uint *)(lVar35 + uVar37 * 4);
                            uVar34 = (ulong)*(uint *)(lVar35 + 0x10 + uVar37 * 4);
                            fVar78 = *(float *)(lVar7 + uVar28 * 4);
                            fVar81 = *(float *)(lVar7 + 4 + uVar28 * 4);
                            fVar84 = *(float *)(lVar7 + 8 + uVar28 * 4);
                            fVar133 = *(float *)(lVar31 + uVar28 * 4);
                            fVar86 = *(float *)(lVar31 + 4 + uVar28 * 4);
                            fVar135 = *(float *)(lVar31 + 8 + uVar28 * 4);
                            auVar56._8_4_ = 0x3f800000;
                            auVar56._0_8_ = &DAT_3f8000003f800000;
                            auVar56._12_4_ = 0x3f800000;
                            auVar48 = vsubps_avx(auVar56,auVar55);
                            fVar87 = auVar48._0_4_;
                            fVar137 = auVar48._4_4_;
                            fVar53 = auVar48._8_4_;
                            fVar77 = auVar48._12_4_;
                            auVar245._0_4_ = fVar87 * fVar78 + fVar41 * fVar133;
                            auVar245._4_4_ = fVar137 * fVar78 + fVar50 * fVar133;
                            auVar245._8_4_ = fVar53 * fVar78 + fVar51 * fVar133;
                            auVar245._12_4_ = fVar77 * fVar78 + fVar75 * fVar133;
                            auVar253._0_4_ = fVar87 * fVar81 + fVar41 * fVar86;
                            auVar253._4_4_ = fVar137 * fVar81 + fVar50 * fVar86;
                            auVar253._8_4_ = fVar53 * fVar81 + fVar51 * fVar86;
                            auVar253._12_4_ = fVar77 * fVar81 + fVar75 * fVar86;
                            auVar147._0_4_ = fVar87 * fVar84 + fVar41 * fVar135;
                            auVar147._4_4_ = fVar137 * fVar84 + fVar50 * fVar135;
                            auVar147._8_4_ = fVar53 * fVar84 + fVar51 * fVar135;
                            auVar147._12_4_ = fVar77 * fVar84 + fVar75 * fVar135;
                            fVar78 = *(float *)(lVar7 + uVar34 * 4);
                            fVar81 = *(float *)(lVar7 + 4 + uVar34 * 4);
                            fVar84 = *(float *)(lVar7 + 8 + uVar34 * 4);
                            fVar133 = *(float *)(lVar31 + uVar34 * 4);
                            fVar86 = *(float *)(lVar31 + 4 + uVar34 * 4);
                            fVar135 = *(float *)(lVar31 + 8 + uVar34 * 4);
                            local_1a98._4_4_ = fVar133 * fVar50 + fVar137 * fVar78;
                            local_1a98._0_4_ = fVar133 * fVar41 + fVar87 * fVar78;
                            fStack_1a90 = fVar133 * fVar51 + fVar53 * fVar78;
                            fStack_1a8c = fVar133 * fVar75 + fVar77 * fVar78;
                            local_1aa8._4_4_ = fVar86 * fVar50 + fVar137 * fVar81;
                            local_1aa8._0_4_ = fVar86 * fVar41 + fVar87 * fVar81;
                            fStack_1aa0 = fVar86 * fVar51 + fVar53 * fVar81;
                            fStack_1a9c = fVar86 * fVar75 + fVar77 * fVar81;
                            local_1a68._4_4_ = fVar135 * fVar50 + fVar137 * fVar84;
                            local_1a68._0_4_ = fVar135 * fVar41 + fVar87 * fVar84;
                            fStack_1a60 = fVar135 * fVar51 + fVar53 * fVar84;
                            fStack_1a5c = fVar135 * fVar75 + fVar77 * fVar84;
                            uVar28 = (ulong)*(uint *)(lVar35 + 0x20 + uVar37 * 4);
                            fVar78 = *(float *)(lVar7 + uVar28 * 4);
                            fVar81 = *(float *)(lVar7 + 4 + uVar28 * 4);
                            fVar84 = *(float *)(lVar7 + 8 + uVar28 * 4);
                            fVar133 = *(float *)(lVar31 + uVar28 * 4);
                            fVar86 = *(float *)(lVar31 + 4 + uVar28 * 4);
                            fVar135 = *(float *)(lVar31 + 8 + uVar28 * 4);
                            local_18d8._4_4_ = fVar133 * fVar50 + fVar137 * fVar78;
                            local_18d8._0_4_ = fVar133 * fVar41 + fVar87 * fVar78;
                            fStack_18d0 = fVar133 * fVar51 + fVar53 * fVar78;
                            fStack_18cc = fVar133 * fVar75 + fVar77 * fVar78;
                            local_18e8._4_4_ = fVar86 * fVar50 + fVar137 * fVar81;
                            local_18e8._0_4_ = fVar86 * fVar41 + fVar87 * fVar81;
                            fStack_18e0 = fVar86 * fVar51 + fVar53 * fVar81;
                            fStack_18dc = fVar86 * fVar75 + fVar77 * fVar81;
                            local_1868 = fVar135 * fVar41 + fVar87 * fVar84;
                            fStack_1864 = fVar135 * fVar50 + fVar137 * fVar84;
                            fStack_1860 = fVar135 * fVar51 + fVar53 * fVar84;
                            fStack_185c = fVar135 * fVar75 + fVar77 * fVar84;
                            uVar28 = (ulong)*(uint *)(lVar35 + 0x30 + uVar37 * 4);
                            fVar78 = *(float *)(lVar31 + uVar28 * 4);
                            fVar81 = *(float *)(lVar31 + 4 + uVar28 * 4);
                            fVar84 = *(float *)(lVar31 + 8 + uVar28 * 4);
                            fVar133 = *(float *)(lVar7 + uVar28 * 4);
                            auVar209._0_4_ = fVar87 * fVar133 + fVar41 * fVar78;
                            auVar209._4_4_ = fVar137 * fVar133 + fVar50 * fVar78;
                            auVar209._8_4_ = fVar53 * fVar133 + fVar51 * fVar78;
                            auVar209._12_4_ = fVar77 * fVar133 + fVar75 * fVar78;
                            fVar78 = *(float *)(lVar7 + 4 + uVar28 * 4);
                            auVar187._0_4_ = fVar87 * fVar78 + fVar41 * fVar81;
                            auVar187._4_4_ = fVar137 * fVar78 + fVar50 * fVar81;
                            auVar187._8_4_ = fVar53 * fVar78 + fVar51 * fVar81;
                            auVar187._12_4_ = fVar77 * fVar78 + fVar75 * fVar81;
                            fVar78 = *(float *)(lVar7 + 8 + uVar28 * 4);
                            auVar57._0_4_ = fVar87 * fVar78 + fVar41 * fVar84;
                            auVar57._4_4_ = fVar137 * fVar78 + fVar50 * fVar84;
                            auVar57._8_4_ = fVar53 * fVar78 + fVar51 * fVar84;
                            auVar57._12_4_ = fVar77 * fVar78 + fVar75 * fVar84;
                          }
                          else {
                            if (uVar26 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar32 = (ulong)*(uint *)(lVar35 + uVar37 * 4);
                              uVar33 = uVar26;
                              uVar34 = uVar28;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar34] * 0x38;
                                auVar48 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar31) + uVar32 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar7 + 0x38 + lVar31) + uVar32 * 4);
                                uVar10 = *puVar2;
                                uVar11 = puVar2[1];
                                uVar12 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar48._0_4_;
                                uVar27 = vextractps_avx(auVar48,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar48,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar27;
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4) = uVar10;
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar11;
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar12;
                                uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                                uVar34 = 0;
                                if (uVar33 != 0) {
                                  for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                              } while (uVar33 != 0);
                            }
                            auVar71._8_4_ = 0x3f800000;
                            auVar71._0_8_ = &DAT_3f8000003f800000;
                            auVar71._12_4_ = 0x3f800000;
                            auVar48 = vsubps_avx(auVar71,auVar55);
                            fVar78 = auVar48._0_4_;
                            fVar138 = fVar78 * (float)p0.field_0._0_4_;
                            fVar81 = auVar48._4_4_;
                            fVar160 = fVar81 * (float)p0.field_0._4_4_;
                            fVar84 = auVar48._8_4_;
                            fVar162 = fVar84 * (float)p0.field_0._8_4_;
                            fVar133 = auVar48._12_4_;
                            fVar165 = fVar133 * (float)p0.field_0._12_4_;
                            fVar217 = fVar78 * (float)p0.field_0._16_4_;
                            fVar219 = fVar81 * (float)p0.field_0._20_4_;
                            fVar226 = fVar84 * (float)p0.field_0._24_4_;
                            fVar227 = fVar133 * (float)p0.field_0._28_4_;
                            fVar86 = fVar78 * (float)p0.field_0._32_4_;
                            fVar137 = fVar81 * (float)p0.field_0._36_4_;
                            fVar80 = fVar84 * (float)p0.field_0._40_4_;
                            fVar206 = fVar133 * (float)p0.field_0._44_4_;
                            fVar135 = fVar41 * (float)p1.field_0._0_4_;
                            fVar53 = fVar50 * (float)p1.field_0._4_4_;
                            fVar83 = fVar51 * (float)p1.field_0._8_4_;
                            fVar235 = fVar75 * (float)p1.field_0._12_4_;
                            fVar87 = fVar41 * (float)p1.field_0._16_4_;
                            fVar77 = fVar50 * (float)p1.field_0._20_4_;
                            fVar229 = fVar51 * (float)p1.field_0._24_4_;
                            fVar236 = fVar75 * (float)p1.field_0._28_4_;
                            fVar213 = fVar41 * (float)p1.field_0._32_4_;
                            fVar85 = fVar50 * (float)p1.field_0._36_4_;
                            fVar164 = fVar51 * (float)p1.field_0._40_4_;
                            fVar215 = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar26 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar32 = (ulong)*(uint *)(lVar35 + 0x10 + uVar37 * 4);
                              uVar33 = uVar26;
                              uVar34 = uVar28;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar34] * 0x38;
                                auVar48 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar31) + uVar32 * 4);
                                auVar55 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + 0x38 + lVar31) + uVar32 * 4);
                                *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar48._0_4_;
                                uVar27 = vextractps_avx(auVar48,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar48,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar27;
                                *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar55._0_4_;
                                uVar27 = vextractps_avx(auVar55,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar55,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar27;
                                uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                                uVar34 = 0;
                                if (uVar33 != 0) {
                                  for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                              } while (uVar33 != 0);
                            }
                            fVar228 = fVar78 * (float)p0.field_0._0_4_;
                            fVar109 = fVar81 * (float)p0.field_0._4_4_;
                            fVar79 = fVar84 * (float)p0.field_0._8_4_;
                            fVar161 = fVar133 * (float)p0.field_0._12_4_;
                            fVar88 = fVar78 * (float)p0.field_0._16_4_;
                            fVar52 = fVar81 * (float)p0.field_0._20_4_;
                            fVar82 = fVar84 * (float)p0.field_0._24_4_;
                            fVar163 = fVar133 * (float)p0.field_0._28_4_;
                            fVar89 = fVar78 * (float)p0.field_0._32_4_;
                            fVar76 = fVar81 * (float)p0.field_0._36_4_;
                            fVar139 = fVar84 * (float)p0.field_0._40_4_;
                            fVar166 = fVar133 * (float)p0.field_0._44_4_;
                            fVar237 = fVar41 * (float)p1.field_0._0_4_;
                            fVar241 = fVar50 * (float)p1.field_0._4_4_;
                            fVar242 = fVar51 * (float)p1.field_0._8_4_;
                            fVar243 = fVar75 * (float)p1.field_0._12_4_;
                            fVar110 = fVar41 * (float)p1.field_0._16_4_;
                            fVar132 = fVar50 * (float)p1.field_0._20_4_;
                            fVar134 = fVar51 * (float)p1.field_0._24_4_;
                            fVar136 = fVar75 * (float)p1.field_0._28_4_;
                            fVar247 = fVar41 * (float)p1.field_0._32_4_;
                            fVar249 = fVar50 * (float)p1.field_0._36_4_;
                            fVar250 = fVar51 * (float)p1.field_0._40_4_;
                            fVar251 = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar26 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar32 = (ulong)*(uint *)(lVar35 + 0x20 + uVar37 * 4);
                              uVar33 = uVar26;
                              uVar34 = uVar28;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar34] * 0x38;
                                auVar48 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar31) + uVar32 * 4);
                                auVar55 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + 0x38 + lVar31) + uVar32 * 4);
                                *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar48._0_4_;
                                uVar27 = vextractps_avx(auVar48,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar48,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar27;
                                *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar55._0_4_;
                                uVar27 = vextractps_avx(auVar55,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar55,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar27;
                                uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                                uVar34 = 0;
                                if (uVar33 != 0) {
                                  for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                              } while (uVar33 != 0);
                            }
                            fVar167 = fVar78 * (float)p0.field_0._0_4_;
                            fVar181 = fVar81 * (float)p0.field_0._4_4_;
                            fVar182 = fVar84 * (float)p0.field_0._8_4_;
                            fVar183 = fVar133 * (float)p0.field_0._12_4_;
                            fVar184 = fVar78 * (float)p0.field_0._16_4_;
                            fVar195 = fVar81 * (float)p0.field_0._20_4_;
                            fVar196 = fVar84 * (float)p0.field_0._24_4_;
                            fVar197 = fVar133 * (float)p0.field_0._28_4_;
                            local_1868 = fVar78 * (float)p0.field_0._32_4_;
                            fStack_1864 = fVar81 * (float)p0.field_0._36_4_;
                            fStack_1860 = fVar84 * (float)p0.field_0._40_4_;
                            fStack_185c = fVar133 * (float)p0.field_0._44_4_;
                            fVar198 = fVar41 * (float)p1.field_0._0_4_;
                            fVar203 = fVar50 * (float)p1.field_0._4_4_;
                            fVar204 = fVar51 * (float)p1.field_0._8_4_;
                            fVar205 = fVar75 * (float)p1.field_0._12_4_;
                            fVar207 = fVar41 * (float)p1.field_0._16_4_;
                            fVar214 = fVar50 * (float)p1.field_0._20_4_;
                            fVar216 = fVar51 * (float)p1.field_0._24_4_;
                            fVar218 = fVar75 * (float)p1.field_0._28_4_;
                            fVar255 = fVar41 * (float)p1.field_0._32_4_;
                            fVar257 = fVar50 * (float)p1.field_0._36_4_;
                            fVar258 = fVar51 * (float)p1.field_0._40_4_;
                            fVar259 = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar26 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar33 = (ulong)*(uint *)(lVar35 + 0x30 + uVar37 * 4);
                              uVar34 = uVar26;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar28] * 0x38;
                                auVar48 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar31) + uVar33 * 4);
                                auVar55 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + 0x38 + lVar31) + uVar33 * 4);
                                *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar48._0_4_;
                                uVar27 = vextractps_avx(auVar48,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar48,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar27;
                                *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar55._0_4_;
                                uVar27 = vextractps_avx(auVar55,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar27;
                                uVar27 = vextractps_avx(auVar55,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar27;
                                uVar34 = uVar34 ^ 1L << (uVar28 & 0x3f);
                                uVar28 = 0;
                                if (uVar34 != 0) {
                                  for (; (uVar34 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                                  }
                                }
                              } while (uVar34 != 0);
                            }
                            auVar245._0_4_ = fVar138 + fVar135;
                            auVar245._4_4_ = fVar160 + fVar53;
                            auVar245._8_4_ = fVar162 + fVar83;
                            auVar245._12_4_ = fVar165 + fVar235;
                            auVar253._0_4_ = fVar217 + fVar87;
                            auVar253._4_4_ = fVar219 + fVar77;
                            auVar253._8_4_ = fVar226 + fVar229;
                            auVar253._12_4_ = fVar227 + fVar236;
                            auVar147._0_4_ = fVar213 + fVar86;
                            auVar147._4_4_ = fVar85 + fVar137;
                            auVar147._8_4_ = fVar164 + fVar80;
                            auVar147._12_4_ = fVar215 + fVar206;
                            local_1a98._4_4_ = fVar241 + fVar109;
                            local_1a98._0_4_ = fVar237 + fVar228;
                            fStack_1a90 = fVar242 + fVar79;
                            fStack_1a8c = fVar243 + fVar161;
                            local_1aa8._4_4_ = fVar132 + fVar52;
                            local_1aa8._0_4_ = fVar110 + fVar88;
                            fStack_1aa0 = fVar134 + fVar82;
                            fStack_1a9c = fVar136 + fVar163;
                            local_1a68._4_4_ = fVar249 + fVar76;
                            local_1a68._0_4_ = fVar247 + fVar89;
                            fStack_1a60 = fVar250 + fVar139;
                            fStack_1a5c = fVar251 + fVar166;
                            local_18d8._4_4_ = fVar181 + fVar203;
                            local_18d8._0_4_ = fVar167 + fVar198;
                            fStack_18d0 = fVar182 + fVar204;
                            fStack_18cc = fVar183 + fVar205;
                            local_18e8._4_4_ = fVar214 + fVar195;
                            local_18e8._0_4_ = fVar207 + fVar184;
                            fStack_18e0 = fVar216 + fVar196;
                            fStack_18dc = fVar218 + fVar197;
                            local_1868 = local_1868 + fVar255;
                            fStack_1864 = fStack_1864 + fVar257;
                            fStack_1860 = fStack_1860 + fVar258;
                            fStack_185c = fStack_185c + fVar259;
                            auVar209._0_4_ =
                                 fVar78 * (float)p0.field_0._0_4_ + fVar41 * (float)p1.field_0._0_4_
                            ;
                            auVar209._4_4_ =
                                 fVar81 * (float)p0.field_0._4_4_ + fVar50 * (float)p1.field_0._4_4_
                            ;
                            auVar209._8_4_ =
                                 fVar84 * (float)p0.field_0._8_4_ + fVar51 * (float)p1.field_0._8_4_
                            ;
                            auVar209._12_4_ =
                                 fVar133 * (float)p0.field_0._12_4_ +
                                 fVar75 * (float)p1.field_0._12_4_;
                            auVar187._0_4_ =
                                 fVar78 * (float)p0.field_0._16_4_ +
                                 fVar41 * (float)p1.field_0._16_4_;
                            auVar187._4_4_ =
                                 fVar81 * (float)p0.field_0._20_4_ +
                                 fVar50 * (float)p1.field_0._20_4_;
                            auVar187._8_4_ =
                                 fVar84 * (float)p0.field_0._24_4_ +
                                 fVar51 * (float)p1.field_0._24_4_;
                            auVar187._12_4_ =
                                 fVar133 * (float)p0.field_0._28_4_ +
                                 fVar75 * (float)p1.field_0._28_4_;
                            auVar57._0_4_ =
                                 fVar78 * (float)p0.field_0._32_4_ +
                                 fVar41 * (float)p1.field_0._32_4_;
                            auVar57._4_4_ =
                                 fVar81 * (float)p0.field_0._36_4_ +
                                 fVar50 * (float)p1.field_0._36_4_;
                            auVar57._8_4_ =
                                 fVar84 * (float)p0.field_0._40_4_ +
                                 fVar51 * (float)p1.field_0._40_4_;
                            auVar57._12_4_ =
                                 fVar133 * (float)p0.field_0._44_4_ +
                                 fVar75 * (float)p1.field_0._44_4_;
                          }
                          auVar48 = *(undefined1 (*) [16])ray;
                          auVar55 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar140 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar120 = vsubps_avx(auVar245,auVar48);
                          auVar141 = vsubps_avx(auVar253,auVar55);
                          auVar168 = vsubps_avx(auVar147,auVar140);
                          auVar185 = vsubps_avx(auVar209,auVar48);
                          auVar121 = vsubps_avx(auVar187,auVar55);
                          auVar208 = vsubps_avx(auVar57,auVar140);
                          auVar220 = vsubps_avx(auVar185,auVar120);
                          auVar221 = vsubps_avx(auVar121,auVar141);
                          auVar238 = vsubps_avx(auVar208,auVar168);
                          fVar41 = auVar141._0_4_;
                          fVar138 = auVar121._0_4_ + fVar41;
                          fVar75 = auVar141._4_4_;
                          fVar160 = auVar121._4_4_ + fVar75;
                          fVar84 = auVar141._8_4_;
                          fVar162 = auVar121._8_4_ + fVar84;
                          fVar135 = auVar141._12_4_;
                          fVar165 = auVar121._12_4_ + fVar135;
                          fVar50 = auVar168._0_4_;
                          fVar206 = auVar208._0_4_ + fVar50;
                          fVar78 = auVar168._4_4_;
                          fVar213 = auVar208._4_4_ + fVar78;
                          fVar133 = auVar168._8_4_;
                          fVar215 = auVar208._8_4_ + fVar133;
                          fVar87 = auVar168._12_4_;
                          fVar217 = auVar208._12_4_ + fVar87;
                          fVar53 = auVar238._0_4_;
                          auVar222._0_4_ = fVar138 * fVar53;
                          fVar83 = auVar238._4_4_;
                          auVar222._4_4_ = fVar160 * fVar83;
                          fVar235 = auVar238._8_4_;
                          auVar222._8_4_ = fVar162 * fVar235;
                          fVar85 = auVar238._12_4_;
                          auVar222._12_4_ = fVar165 * fVar85;
                          fVar77 = auVar221._0_4_;
                          auVar230._0_4_ = fVar206 * fVar77;
                          fVar229 = auVar221._4_4_;
                          auVar230._4_4_ = fVar213 * fVar229;
                          fVar236 = auVar221._8_4_;
                          auVar230._8_4_ = fVar215 * fVar236;
                          fVar164 = auVar221._12_4_;
                          auVar230._12_4_ = fVar217 * fVar164;
                          auVar221 = vsubps_avx(auVar230,auVar222);
                          fVar51 = auVar120._0_4_;
                          fVar219 = auVar185._0_4_ + fVar51;
                          fVar81 = auVar120._4_4_;
                          fVar226 = auVar185._4_4_ + fVar81;
                          fVar86 = auVar120._8_4_;
                          fVar227 = auVar185._8_4_ + fVar86;
                          fVar137 = auVar120._12_4_;
                          fVar228 = auVar185._12_4_ + fVar137;
                          fVar80 = auVar220._0_4_;
                          auVar210._0_4_ = fVar206 * fVar80;
                          fVar206 = auVar220._4_4_;
                          auVar210._4_4_ = fVar213 * fVar206;
                          fVar213 = auVar220._8_4_;
                          auVar210._8_4_ = fVar215 * fVar213;
                          fVar215 = auVar220._12_4_;
                          auVar210._12_4_ = fVar217 * fVar215;
                          auVar231._0_4_ = fVar219 * fVar53;
                          auVar231._4_4_ = fVar226 * fVar83;
                          auVar231._8_4_ = fVar227 * fVar235;
                          auVar231._12_4_ = fVar228 * fVar85;
                          auVar238 = vsubps_avx(auVar231,auVar210);
                          auVar211._0_4_ = fVar219 * fVar77;
                          auVar211._4_4_ = fVar226 * fVar229;
                          auVar211._8_4_ = fVar227 * fVar236;
                          auVar211._12_4_ = fVar228 * fVar164;
                          auVar148._0_4_ = fVar80 * fVar138;
                          auVar148._4_4_ = fVar206 * fVar160;
                          auVar148._8_4_ = fVar213 * fVar162;
                          auVar148._12_4_ = fVar215 * fVar165;
                          auVar42 = vsubps_avx(auVar148,auVar211);
                          fVar138 = *(float *)(ray + 0x60);
                          fVar160 = *(float *)(ray + 100);
                          fVar162 = *(float *)(ray + 0x68);
                          auVar18 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar165 = *(float *)(ray + 0x6c);
                          fVar217 = *(float *)(ray + 0x50);
                          fVar219 = *(float *)(ray + 0x54);
                          fVar226 = *(float *)(ray + 0x58);
                          auVar19 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar227 = *(float *)(ray + 0x5c);
                          fVar228 = *(float *)(ray + 0x40);
                          fVar88 = *(float *)(ray + 0x44);
                          fVar89 = *(float *)(ray + 0x48);
                          auVar20 = *(undefined1 (*) [12])(ray + 0x40);
                          fVar109 = *(float *)(ray + 0x4c);
                          auVar223._0_4_ =
                               fVar228 * auVar221._0_4_ +
                               auVar238._0_4_ * fVar217 + fVar138 * auVar42._0_4_;
                          auVar223._4_4_ =
                               fVar88 * auVar221._4_4_ +
                               auVar238._4_4_ * fVar219 + fVar160 * auVar42._4_4_;
                          auVar223._8_4_ =
                               fVar89 * auVar221._8_4_ +
                               auVar238._8_4_ * fVar226 + fVar162 * auVar42._8_4_;
                          auVar223._12_4_ =
                               fVar109 * auVar221._12_4_ +
                               auVar238._12_4_ * fVar227 + fVar165 * auVar42._12_4_;
                          auVar55 = vsubps_avx(_local_1aa8,auVar55);
                          auVar140 = vsubps_avx(_local_1a68,auVar140);
                          auVar141 = vsubps_avx(auVar141,auVar55);
                          auVar168 = vsubps_avx(auVar168,auVar140);
                          fVar139 = fVar41 + auVar55._0_4_;
                          fVar161 = fVar75 + auVar55._4_4_;
                          fVar163 = fVar84 + auVar55._8_4_;
                          fVar166 = fVar135 + auVar55._12_4_;
                          fVar52 = fVar50 + auVar140._0_4_;
                          fVar76 = fVar78 + auVar140._4_4_;
                          fVar79 = fVar133 + auVar140._8_4_;
                          fVar82 = fVar87 + auVar140._12_4_;
                          fVar241 = auVar168._0_4_;
                          auVar92._0_4_ = fVar241 * fVar139;
                          fVar242 = auVar168._4_4_;
                          auVar92._4_4_ = fVar242 * fVar161;
                          fVar243 = auVar168._8_4_;
                          auVar92._8_4_ = fVar243 * fVar163;
                          fVar247 = auVar168._12_4_;
                          auVar92._12_4_ = fVar247 * fVar166;
                          fVar195 = auVar141._0_4_;
                          auVar114._0_4_ = fVar195 * fVar52;
                          fVar197 = auVar141._4_4_;
                          auVar114._4_4_ = fVar197 * fVar76;
                          fVar203 = auVar141._8_4_;
                          auVar114._8_4_ = fVar203 * fVar79;
                          fVar205 = auVar141._12_4_;
                          auVar114._12_4_ = fVar205 * fVar82;
                          auVar141 = vsubps_avx(auVar114,auVar92);
                          auVar48 = vsubps_avx(_local_1a98,auVar48);
                          auVar120 = vsubps_avx(auVar120,auVar48);
                          fVar249 = auVar120._0_4_;
                          auVar58._0_4_ = fVar249 * fVar52;
                          fVar250 = auVar120._4_4_;
                          auVar58._4_4_ = fVar250 * fVar76;
                          fVar251 = auVar120._8_4_;
                          auVar58._8_4_ = fVar251 * fVar79;
                          fVar167 = auVar120._12_4_;
                          auVar58._12_4_ = fVar167 * fVar82;
                          fVar52 = fVar51 + auVar48._0_4_;
                          fVar76 = fVar81 + auVar48._4_4_;
                          fVar79 = fVar86 + auVar48._8_4_;
                          fVar82 = fVar137 + auVar48._12_4_;
                          auVar212._0_4_ = fVar241 * fVar52;
                          auVar212._4_4_ = fVar242 * fVar76;
                          auVar212._8_4_ = fVar243 * fVar79;
                          auVar212._12_4_ = fVar247 * fVar82;
                          auVar120 = vsubps_avx(auVar212,auVar58);
                          auVar200._0_4_ = fVar195 * fVar52;
                          auVar200._4_4_ = fVar197 * fVar76;
                          auVar200._8_4_ = fVar203 * fVar79;
                          auVar200._12_4_ = fVar205 * fVar82;
                          auVar149._0_4_ = fVar249 * fVar139;
                          auVar149._4_4_ = fVar250 * fVar161;
                          auVar149._8_4_ = fVar251 * fVar163;
                          auVar149._12_4_ = fVar167 * fVar166;
                          auVar168 = vsubps_avx(auVar149,auVar200);
                          auVar201._0_4_ =
                               fVar228 * auVar141._0_4_ +
                               fVar138 * auVar168._0_4_ + fVar217 * auVar120._0_4_;
                          auVar201._4_4_ =
                               fVar88 * auVar141._4_4_ +
                               fVar160 * auVar168._4_4_ + fVar219 * auVar120._4_4_;
                          auVar201._8_4_ =
                               fVar89 * auVar141._8_4_ +
                               fVar162 * auVar168._8_4_ + fVar226 * auVar120._8_4_;
                          auVar201._12_4_ =
                               fVar109 * auVar141._12_4_ +
                               fVar165 * auVar168._12_4_ + fVar227 * auVar120._12_4_;
                          auVar120 = vsubps_avx(auVar48,auVar185);
                          fVar52 = auVar185._0_4_ + auVar48._0_4_;
                          fVar76 = auVar185._4_4_ + auVar48._4_4_;
                          fVar79 = auVar185._8_4_ + auVar48._8_4_;
                          fVar82 = auVar185._12_4_ + auVar48._12_4_;
                          auVar48 = vsubps_avx(auVar55,auVar121);
                          fVar139 = auVar55._0_4_ + auVar121._0_4_;
                          fVar161 = auVar55._4_4_ + auVar121._4_4_;
                          fVar163 = auVar55._8_4_ + auVar121._8_4_;
                          fVar166 = auVar55._12_4_ + auVar121._12_4_;
                          auVar55 = vsubps_avx(auVar140,auVar208);
                          fVar110 = auVar140._0_4_ + auVar208._0_4_;
                          fVar132 = auVar140._4_4_ + auVar208._4_4_;
                          fVar134 = auVar140._8_4_ + auVar208._8_4_;
                          fVar136 = auVar140._12_4_ + auVar208._12_4_;
                          fVar181 = auVar55._0_4_;
                          auVar172._0_4_ = fVar181 * fVar139;
                          fVar182 = auVar55._4_4_;
                          auVar172._4_4_ = fVar182 * fVar161;
                          fVar183 = auVar55._8_4_;
                          auVar172._8_4_ = fVar183 * fVar163;
                          fVar184 = auVar55._12_4_;
                          auVar172._12_4_ = fVar184 * fVar166;
                          fVar196 = auVar48._0_4_;
                          auVar188._0_4_ = fVar196 * fVar110;
                          fVar198 = auVar48._4_4_;
                          auVar188._4_4_ = fVar198 * fVar132;
                          fVar204 = auVar48._8_4_;
                          auVar188._8_4_ = fVar204 * fVar134;
                          fVar207 = auVar48._12_4_;
                          auVar188._12_4_ = fVar207 * fVar136;
                          auVar48 = vsubps_avx(auVar188,auVar172);
                          fVar237 = auVar120._0_4_;
                          auVar115._0_4_ = fVar237 * fVar110;
                          fVar110 = auVar120._4_4_;
                          auVar115._4_4_ = fVar110 * fVar132;
                          fVar132 = auVar120._8_4_;
                          auVar115._8_4_ = fVar132 * fVar134;
                          fVar134 = auVar120._12_4_;
                          auVar115._12_4_ = fVar134 * fVar136;
                          auVar189._0_4_ = fVar181 * fVar52;
                          auVar189._4_4_ = fVar182 * fVar76;
                          auVar189._8_4_ = fVar183 * fVar79;
                          auVar189._12_4_ = fVar184 * fVar82;
                          auVar55 = vsubps_avx(auVar189,auVar115);
                          auVar59._0_4_ = fVar196 * fVar52;
                          auVar59._4_4_ = fVar198 * fVar76;
                          auVar59._8_4_ = fVar204 * fVar79;
                          auVar59._12_4_ = fVar207 * fVar82;
                          auVar93._0_4_ = fVar237 * fVar139;
                          auVar93._4_4_ = fVar110 * fVar161;
                          auVar93._8_4_ = fVar132 * fVar163;
                          auVar93._12_4_ = fVar134 * fVar166;
                          auVar140 = vsubps_avx(auVar93,auVar59);
                          auVar60._0_4_ =
                               fVar228 * auVar48._0_4_ +
                               fVar138 * auVar140._0_4_ + fVar217 * auVar55._0_4_;
                          auVar60._4_4_ =
                               fVar88 * auVar48._4_4_ +
                               fVar160 * auVar140._4_4_ + fVar219 * auVar55._4_4_;
                          auVar60._8_4_ =
                               fVar89 * auVar48._8_4_ +
                               fVar162 * auVar140._8_4_ + fVar226 * auVar55._8_4_;
                          auVar60._12_4_ =
                               fVar109 * auVar48._12_4_ +
                               fVar165 * auVar140._12_4_ + fVar227 * auVar55._12_4_;
                          auVar44._0_4_ = auVar60._0_4_ + auVar223._0_4_ + auVar201._0_4_;
                          auVar44._4_4_ = auVar60._4_4_ + auVar223._4_4_ + auVar201._4_4_;
                          auVar44._8_4_ = auVar60._8_4_ + auVar223._8_4_ + auVar201._8_4_;
                          auVar44._12_4_ = auVar60._12_4_ + auVar223._12_4_ + auVar201._12_4_;
                          auVar48 = vminps_avx(auVar223,auVar201);
                          auVar55 = vminps_avx(auVar48,auVar60);
                          auVar190._8_4_ = 0x7fffffff;
                          auVar190._0_8_ = 0x7fffffff7fffffff;
                          auVar190._12_4_ = 0x7fffffff;
                          auVar48 = vandps_avx(auVar44,auVar190);
                          auVar116._0_4_ = auVar48._0_4_ * 1.1920929e-07;
                          auVar116._4_4_ = auVar48._4_4_ * 1.1920929e-07;
                          auVar116._8_4_ = auVar48._8_4_ * 1.1920929e-07;
                          auVar116._12_4_ = auVar48._12_4_ * 1.1920929e-07;
                          uVar28 = CONCAT44(auVar116._4_4_,auVar116._0_4_);
                          auVar173._0_8_ = uVar28 ^ 0x8000000080000000;
                          auVar173._8_4_ = -auVar116._8_4_;
                          auVar173._12_4_ = -auVar116._12_4_;
                          auVar55 = vcmpps_avx(auVar55,auVar173,5);
                          auVar140 = vmaxps_avx(auVar223,auVar201);
                          auVar140 = vmaxps_avx(auVar140,auVar60);
                          auVar140 = vcmpps_avx(auVar140,auVar116,2);
                          auVar55 = vorps_avx(auVar55,auVar140);
                          auVar140 = local_1a58 & auVar55;
                          if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar140 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar140 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar140[0xf] < '\0') {
                            auVar61._0_4_ = fVar53 * fVar195;
                            auVar61._4_4_ = fVar83 * fVar197;
                            auVar61._8_4_ = fVar235 * fVar203;
                            auVar61._12_4_ = fVar85 * fVar205;
                            auVar94._0_4_ = fVar77 * fVar241;
                            auVar94._4_4_ = fVar229 * fVar242;
                            auVar94._8_4_ = fVar236 * fVar243;
                            auVar94._12_4_ = fVar164 * fVar247;
                            auVar141 = vsubps_avx(auVar94,auVar61);
                            auVar117._0_4_ = fVar196 * fVar241;
                            auVar117._4_4_ = fVar198 * fVar242;
                            auVar117._8_4_ = fVar204 * fVar243;
                            auVar117._12_4_ = fVar207 * fVar247;
                            auVar174._0_4_ = fVar181 * fVar195;
                            auVar174._4_4_ = fVar182 * fVar197;
                            auVar174._8_4_ = fVar183 * fVar203;
                            auVar174._12_4_ = fVar184 * fVar205;
                            auVar168 = vsubps_avx(auVar174,auVar117);
                            auVar140 = vandps_avx(auVar61,auVar190);
                            auVar120 = vandps_avx(auVar117,auVar190);
                            auVar140 = vcmpps_avx(auVar140,auVar120,1);
                            auVar141 = vblendvps_avx(auVar168,auVar141,auVar140);
                            auVar62._0_4_ = fVar249 * fVar181;
                            auVar62._4_4_ = fVar250 * fVar182;
                            auVar62._8_4_ = fVar251 * fVar183;
                            auVar62._12_4_ = fVar167 * fVar184;
                            auVar95._0_4_ = fVar249 * fVar53;
                            auVar95._4_4_ = fVar250 * fVar83;
                            auVar95._8_4_ = fVar251 * fVar235;
                            auVar95._12_4_ = fVar167 * fVar85;
                            auVar118._0_4_ = fVar80 * fVar241;
                            auVar118._4_4_ = fVar206 * fVar242;
                            auVar118._8_4_ = fVar213 * fVar243;
                            auVar118._12_4_ = fVar215 * fVar247;
                            auVar168 = vsubps_avx(auVar95,auVar118);
                            auVar175._0_4_ = fVar241 * fVar237;
                            auVar175._4_4_ = fVar242 * fVar110;
                            auVar175._8_4_ = fVar243 * fVar132;
                            auVar175._12_4_ = fVar247 * fVar134;
                            auVar185 = vsubps_avx(auVar175,auVar62);
                            auVar140 = vandps_avx(auVar118,auVar190);
                            auVar120 = vandps_avx(auVar62,auVar190);
                            auVar140 = vcmpps_avx(auVar140,auVar120,1);
                            auVar168 = vblendvps_avx(auVar185,auVar168,auVar140);
                            auVar63._0_4_ = fVar237 * fVar195;
                            auVar63._4_4_ = fVar110 * fVar197;
                            auVar63._8_4_ = fVar132 * fVar203;
                            auVar63._12_4_ = fVar134 * fVar205;
                            auVar96._0_4_ = fVar80 * fVar195;
                            auVar96._4_4_ = fVar206 * fVar197;
                            auVar96._8_4_ = fVar213 * fVar203;
                            auVar96._12_4_ = fVar215 * fVar205;
                            auVar119._0_4_ = fVar249 * fVar77;
                            auVar119._4_4_ = fVar250 * fVar229;
                            auVar119._8_4_ = fVar251 * fVar236;
                            auVar119._12_4_ = fVar167 * fVar164;
                            auVar45._0_4_ = fVar249 * fVar196;
                            auVar45._4_4_ = fVar250 * fVar198;
                            auVar45._8_4_ = fVar251 * fVar204;
                            auVar45._12_4_ = fVar167 * fVar207;
                            auVar185 = vsubps_avx(auVar96,auVar119);
                            auVar121 = vsubps_avx(auVar45,auVar63);
                            auVar140 = vandps_avx(auVar119,auVar190);
                            auVar120 = vandps_avx(auVar63,auVar190);
                            auVar140 = vcmpps_avx(auVar140,auVar120,1);
                            auVar185 = vblendvps_avx(auVar121,auVar185,auVar140);
                            local_19f8 = auVar18._0_4_;
                            fStack_19f4 = auVar18._4_4_;
                            fStack_19f0 = auVar18._8_4_;
                            local_1a08 = auVar19._0_4_;
                            fStack_1a04 = auVar19._4_4_;
                            fStack_1a00 = auVar19._8_4_;
                            local_18b8 = auVar20._0_4_;
                            fStack_18b4 = auVar20._4_4_;
                            fStack_18b0 = auVar20._8_4_;
                            fVar53 = auVar141._0_4_ * local_18b8 +
                                     auVar185._0_4_ * local_19f8 + auVar168._0_4_ * local_1a08;
                            fVar77 = auVar141._4_4_ * fStack_18b4 +
                                     auVar185._4_4_ * fStack_19f4 + auVar168._4_4_ * fStack_1a04;
                            fVar80 = auVar141._8_4_ * fStack_18b0 +
                                     auVar185._8_4_ * fStack_19f0 + auVar168._8_4_ * fStack_1a00;
                            fVar83 = auVar141._12_4_ * fVar109 +
                                     auVar185._12_4_ * fVar165 + auVar168._12_4_ * fVar227;
                            auVar97._0_4_ = fVar53 + fVar53;
                            auVar97._4_4_ = fVar77 + fVar77;
                            auVar97._8_4_ = fVar80 + fVar80;
                            auVar97._12_4_ = fVar83 + fVar83;
                            fVar53 = auVar141._0_4_ * fVar51 +
                                     auVar185._0_4_ * fVar50 + auVar168._0_4_ * fVar41;
                            fVar78 = auVar141._4_4_ * fVar81 +
                                     auVar185._4_4_ * fVar78 + auVar168._4_4_ * fVar75;
                            fVar81 = auVar141._8_4_ * fVar86 +
                                     auVar185._8_4_ * fVar133 + auVar168._8_4_ * fVar84;
                            fVar84 = auVar141._12_4_ * fVar137 +
                                     auVar185._12_4_ * fVar87 + auVar168._12_4_ * fVar135;
                            auVar140 = vrcpps_avx(auVar97);
                            fVar41 = auVar140._0_4_;
                            auVar150._0_4_ = auVar97._0_4_ * fVar41;
                            fVar50 = auVar140._4_4_;
                            auVar150._4_4_ = auVar97._4_4_ * fVar50;
                            fVar51 = auVar140._8_4_;
                            auVar150._8_4_ = auVar97._8_4_ * fVar51;
                            fVar75 = auVar140._12_4_;
                            auVar150._12_4_ = auVar97._12_4_ * fVar75;
                            auVar176._8_4_ = 0x3f800000;
                            auVar176._0_8_ = &DAT_3f8000003f800000;
                            auVar176._12_4_ = 0x3f800000;
                            auVar140 = vsubps_avx(auVar176,auVar150);
                            auVar64._0_4_ = (fVar53 + fVar53) * (fVar41 + fVar41 * auVar140._0_4_);
                            auVar64._4_4_ = (fVar78 + fVar78) * (fVar50 + fVar50 * auVar140._4_4_);
                            auVar64._8_4_ = (fVar81 + fVar81) * (fVar51 + fVar51 * auVar140._8_4_);
                            auVar64._12_4_ = (fVar84 + fVar84) * (fVar75 + fVar75 * auVar140._12_4_)
                            ;
                            auVar140 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar120 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar64,2);
                            auVar121 = vcmpps_avx(auVar64,auVar140,2);
                            auVar120 = vandps_avx(auVar120,auVar121);
                            auVar208 = ZEXT816(0) << 0x20;
                            auVar121 = vcmpps_avx(auVar208,auVar97,4);
                            auVar120 = vandps_avx(auVar121,auVar120);
                            auVar55 = vandps_avx(auVar55,local_1a58);
                            auVar120 = vpslld_avx(auVar120,0x1f);
                            auVar121 = vpsrad_avx(auVar120,0x1f);
                            auVar120 = auVar55 & auVar121;
                            if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar120 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar120 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar120[0xf] < '\0') {
                              auVar55 = vandps_avx(auVar121,auVar55);
                              uVar3 = pGVar6->mask;
                              auVar122._4_4_ = uVar3;
                              auVar122._0_4_ = uVar3;
                              auVar122._8_4_ = uVar3;
                              auVar122._12_4_ = uVar3;
                              auVar120 = vandps_avx(auVar122,*(undefined1 (*) [16])(ray + 0x90));
                              auVar120 = vpcmpeqd_avx(auVar208,auVar120);
                              auVar221 = auVar55 & ~auVar120;
                              auVar121 = vpcmpeqd_avx(auVar220,auVar220);
                              if ((((auVar221 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar221 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar221 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar221[0xf] < '\0') {
                                aVar72 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         vandnps_avx(auVar120,auVar55);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar55 = vrcpps_avx(auVar44);
                                  fVar41 = auVar55._0_4_;
                                  auVar157._0_4_ = auVar44._0_4_ * fVar41;
                                  fVar50 = auVar55._4_4_;
                                  auVar157._4_4_ = auVar44._4_4_ * fVar50;
                                  fVar51 = auVar55._8_4_;
                                  auVar157._8_4_ = auVar44._8_4_ * fVar51;
                                  fVar75 = auVar55._12_4_;
                                  auVar157._12_4_ = auVar44._12_4_ * fVar75;
                                  auVar193._8_4_ = 0x3f800000;
                                  auVar193._0_8_ = &DAT_3f8000003f800000;
                                  auVar193._12_4_ = 0x3f800000;
                                  auVar55 = vsubps_avx(auVar193,auVar157);
                                  auVar127._0_4_ = fVar41 + fVar41 * auVar55._0_4_;
                                  auVar127._4_4_ = fVar50 + fVar50 * auVar55._4_4_;
                                  auVar127._8_4_ = fVar51 + fVar51 * auVar55._8_4_;
                                  auVar127._12_4_ = fVar75 + fVar75 * auVar55._12_4_;
                                  auVar158._8_4_ = 0x219392ef;
                                  auVar158._0_8_ = 0x219392ef219392ef;
                                  auVar158._12_4_ = 0x219392ef;
                                  auVar48 = vcmpps_avx(auVar48,auVar158,5);
                                  auVar48 = vandps_avx(auVar48,auVar127);
                                  auVar159._0_4_ = auVar48._0_4_ * auVar223._0_4_;
                                  auVar159._4_4_ = auVar48._4_4_ * auVar223._4_4_;
                                  auVar159._8_4_ = auVar48._8_4_ * auVar223._8_4_;
                                  auVar159._12_4_ = auVar48._12_4_ * auVar223._12_4_;
                                  auVar55 = vminps_avx(auVar159,auVar193);
                                  auVar128._0_4_ = auVar48._0_4_ * auVar201._0_4_;
                                  auVar128._4_4_ = auVar48._4_4_ * auVar201._4_4_;
                                  auVar128._8_4_ = auVar48._8_4_ * auVar201._8_4_;
                                  auVar128._12_4_ = auVar48._12_4_ * auVar201._12_4_;
                                  auVar48 = vminps_avx(auVar128,auVar193);
                                  auVar120 = vsubps_avx(auVar193,auVar55);
                                  auVar220 = vsubps_avx(auVar193,auVar48);
                                  auVar17._8_8_ = uVar22;
                                  auVar17._0_8_ = uVar21;
                                  vblendvps_avx(auVar55,auVar120,auVar17);
                                  vblendvps_avx(auVar48,auVar220,auVar17);
                                  vpshufd_avx(ZEXT416(uVar4),0);
                                  vpshufd_avx(ZEXT416(uVar23),0);
                                  p0.field_0._0_16_ = auVar141;
                                  p0.field_0._16_16_ = auVar168;
                                  p0.field_0._32_16_ = auVar185;
                                  vcmpps_avx(ZEXT1632(auVar185),ZEXT1632(auVar185),0xf);
                                  auVar48 = vblendvps_avx(auVar140,auVar64,(undefined1  [16])aVar72)
                                  ;
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar48;
                                  itime.field_0 = aVar72;
                                  p1.field_0._0_8_ = &itime;
                                  p1.field_0._8_8_ = pGVar6->userPtr;
                                  p1.field_0._16_8_ = context->user;
                                  p1.field_0._24_8_ = ray;
                                  p1.field_0._32_8_ = &p0;
                                  p1.field_0._40_4_ = 4;
                                  if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar6->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                    auVar208 = ZEXT816(0) << 0x40;
                                    auVar121 = vpcmpeqd_avx(auVar121,auVar121);
                                  }
                                  if (itime.field_0 ==
                                      (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                    auVar48 = vpcmpeqd_avx(auVar208,(undefined1  [16])0x0);
                                    auVar121 = auVar121 ^ auVar48;
                                  }
                                  else {
                                    p_Var8 = context->args->filter;
                                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var8)((RTCFilterFunctionNArguments *)&p1);
                                      auVar208 = ZEXT816(0) << 0x40;
                                      auVar121 = vpcmpeqd_avx(auVar121,auVar121);
                                    }
                                    auVar48 = vpcmpeqd_avx(auVar208,(undefined1  [16])itime.field_0)
                                    ;
                                    auVar121 = auVar121 ^ auVar48;
                                    auVar104._8_4_ = 0xff800000;
                                    auVar104._0_8_ = 0xff800000ff800000;
                                    auVar104._12_4_ = 0xff800000;
                                    auVar48 = vblendvps_avx(auVar104,*(undefined1 (*) [16])
                                                                      (p1.field_0._24_8_ + 0x80),
                                                            auVar48);
                                    *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar48;
                                  }
                                  auVar48 = vpslld_avx(auVar121,0x1f);
                                  aVar72 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                           vpsrad_avx(auVar48,0x1f);
                                  auVar48 = vblendvps_avx(auVar140,*(undefined1 (*) [16])pRVar1,
                                                          auVar48);
                                  *(undefined1 (*) [16])pRVar1 = auVar48;
                                }
                                local_1a58 = vpandn_avx((undefined1  [16])aVar72,local_1a58);
                              }
                            }
                          }
                          if ((((local_1a58 >> 0x1f & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0 &&
                               (local_1a58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (local_1a58 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < local_1a58[0xf]) {
                            bVar40 = false;
                          }
                          else {
                            auVar48 = *(undefined1 (*) [16])ray;
                            auVar55 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar140 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar120 = vsubps_avx(_local_18d8,auVar48);
                            auVar141 = vsubps_avx(_local_18e8,auVar55);
                            auVar13._4_4_ = fStack_1864;
                            auVar13._0_4_ = local_1868;
                            auVar13._8_4_ = fStack_1860;
                            auVar13._12_4_ = fStack_185c;
                            auVar168 = vsubps_avx(auVar13,auVar140);
                            auVar185 = vsubps_avx(auVar209,auVar48);
                            auVar121 = vsubps_avx(auVar187,auVar55);
                            auVar208 = vsubps_avx(auVar57,auVar140);
                            auVar220 = vsubps_avx(_local_1a98,auVar48);
                            auVar55 = vsubps_avx(_local_1aa8,auVar55);
                            auVar140 = vsubps_avx(_local_1a68,auVar140);
                            auVar48 = vsubps_avx(auVar220,auVar120);
                            auVar221 = vsubps_avx(auVar55,auVar141);
                            auVar238 = vsubps_avx(auVar140,auVar168);
                            fVar195 = auVar141._0_4_;
                            fVar81 = fVar195 + auVar55._0_4_;
                            fVar197 = auVar141._4_4_;
                            fVar133 = fVar197 + auVar55._4_4_;
                            fVar203 = auVar141._8_4_;
                            fVar135 = fVar203 + auVar55._8_4_;
                            fVar205 = auVar141._12_4_;
                            fVar137 = fVar205 + auVar55._12_4_;
                            fVar41 = auVar168._0_4_;
                            fVar53 = auVar140._0_4_ + fVar41;
                            fVar50 = auVar168._4_4_;
                            fVar77 = auVar140._4_4_ + fVar50;
                            fVar51 = auVar168._8_4_;
                            fVar80 = auVar140._8_4_ + fVar51;
                            fVar75 = auVar168._12_4_;
                            fVar83 = auVar140._12_4_ + fVar75;
                            fVar78 = auVar238._0_4_;
                            auVar232._0_4_ = fVar81 * fVar78;
                            fVar84 = auVar238._4_4_;
                            auVar232._4_4_ = fVar133 * fVar84;
                            fVar86 = auVar238._8_4_;
                            auVar232._8_4_ = fVar135 * fVar86;
                            fVar87 = auVar238._12_4_;
                            auVar232._12_4_ = fVar137 * fVar87;
                            fVar249 = auVar221._0_4_;
                            auVar239._0_4_ = fVar249 * fVar53;
                            fVar250 = auVar221._4_4_;
                            auVar239._4_4_ = fVar250 * fVar77;
                            fVar251 = auVar221._8_4_;
                            auVar239._8_4_ = fVar251 * fVar80;
                            fVar167 = auVar221._12_4_;
                            auVar239._12_4_ = fVar167 * fVar83;
                            auVar221 = vsubps_avx(auVar239,auVar232);
                            fVar76 = auVar120._0_4_;
                            fVar229 = fVar76 + auVar220._0_4_;
                            fVar82 = auVar120._4_4_;
                            fVar206 = fVar82 + auVar220._4_4_;
                            fVar161 = auVar120._8_4_;
                            fVar235 = fVar161 + auVar220._8_4_;
                            fVar166 = auVar120._12_4_;
                            fVar236 = fVar166 + auVar220._12_4_;
                            fVar213 = auVar48._0_4_;
                            auVar202._0_4_ = fVar213 * fVar53;
                            fVar164 = auVar48._4_4_;
                            auVar202._4_4_ = fVar164 * fVar77;
                            fVar138 = auVar48._8_4_;
                            auVar202._8_4_ = fVar138 * fVar80;
                            fVar162 = auVar48._12_4_;
                            auVar202._12_4_ = fVar162 * fVar83;
                            auVar240._0_4_ = fVar229 * fVar78;
                            auVar240._4_4_ = fVar206 * fVar84;
                            auVar240._8_4_ = fVar235 * fVar86;
                            auVar240._12_4_ = fVar236 * fVar87;
                            auVar238 = vsubps_avx(auVar240,auVar202);
                            auVar233._0_4_ = fVar229 * fVar249;
                            auVar233._4_4_ = fVar206 * fVar250;
                            auVar233._8_4_ = fVar235 * fVar251;
                            auVar233._12_4_ = fVar236 * fVar167;
                            auVar123._0_4_ = fVar213 * fVar81;
                            auVar123._4_4_ = fVar164 * fVar133;
                            auVar123._8_4_ = fVar138 * fVar135;
                            auVar123._12_4_ = fVar162 * fVar137;
                            auVar42 = vsubps_avx(auVar123,auVar233);
                            fVar53 = *(float *)(ray + 0x60);
                            fVar77 = *(float *)(ray + 100);
                            fVar80 = *(float *)(ray + 0x68);
                            auVar18 = *(undefined1 (*) [12])(ray + 0x60);
                            fVar83 = *(float *)(ray + 0x6c);
                            auVar48 = *(undefined1 (*) [16])(ray + 0x50);
                            fVar241 = auVar48._0_4_;
                            fVar242 = auVar48._4_4_;
                            fVar243 = auVar48._8_4_;
                            fVar247 = auVar48._12_4_;
                            auVar48 = *(undefined1 (*) [16])(ray + 0x40);
                            fVar181 = auVar48._0_4_;
                            fVar182 = auVar48._4_4_;
                            fVar183 = auVar48._8_4_;
                            fVar184 = auVar48._12_4_;
                            local_1a98._0_4_ =
                                 fVar181 * auVar221._0_4_ +
                                 auVar42._0_4_ * fVar53 + fVar241 * auVar238._0_4_;
                            local_1a98._4_4_ =
                                 fVar182 * auVar221._4_4_ +
                                 auVar42._4_4_ * fVar77 + fVar242 * auVar238._4_4_;
                            fStack_1a90 = fVar183 * auVar221._8_4_ +
                                          auVar42._8_4_ * fVar80 + fVar243 * auVar238._8_4_;
                            fStack_1a8c = fVar184 * auVar221._12_4_ +
                                          auVar42._12_4_ * fVar83 + fVar247 * auVar238._12_4_;
                            auVar48 = vsubps_avx(auVar141,auVar121);
                            auVar141 = vsubps_avx(auVar168,auVar208);
                            fVar229 = fVar195 + auVar121._0_4_;
                            fVar206 = fVar197 + auVar121._4_4_;
                            fVar235 = fVar203 + auVar121._8_4_;
                            fVar236 = fVar205 + auVar121._12_4_;
                            fVar81 = auVar208._0_4_ + fVar41;
                            fVar133 = auVar208._4_4_ + fVar50;
                            fVar135 = auVar208._8_4_ + fVar51;
                            fVar137 = auVar208._12_4_ + fVar75;
                            auVar254._8_4_ = 0x7fffffff;
                            auVar254._0_8_ = 0x7fffffff7fffffff;
                            auVar254._12_4_ = 0x7fffffff;
                            fVar132 = auVar141._0_4_;
                            auVar256._0_4_ = fVar132 * fVar229;
                            fVar134 = auVar141._4_4_;
                            auVar256._4_4_ = fVar134 * fVar206;
                            fVar136 = auVar141._8_4_;
                            auVar256._8_4_ = fVar136 * fVar235;
                            fVar237 = auVar141._12_4_;
                            auVar256._12_4_ = fVar237 * fVar236;
                            fVar88 = auVar48._0_4_;
                            auVar151._0_4_ = fVar88 * fVar81;
                            fVar89 = auVar48._4_4_;
                            auVar151._4_4_ = fVar89 * fVar133;
                            fVar109 = auVar48._8_4_;
                            auVar151._8_4_ = fVar109 * fVar135;
                            fVar52 = auVar48._12_4_;
                            auVar151._12_4_ = fVar52 * fVar137;
                            auVar48 = vsubps_avx(auVar151,auVar256);
                            auVar120 = vsubps_avx(auVar120,auVar185);
                            fVar196 = auVar120._0_4_;
                            auVar98._0_4_ = fVar196 * fVar81;
                            fVar198 = auVar120._4_4_;
                            auVar98._4_4_ = fVar198 * fVar133;
                            fVar204 = auVar120._8_4_;
                            auVar98._8_4_ = fVar204 * fVar135;
                            fVar207 = auVar120._12_4_;
                            auVar98._12_4_ = fVar207 * fVar137;
                            fVar81 = fVar76 + auVar185._0_4_;
                            fVar133 = fVar82 + auVar185._4_4_;
                            fVar135 = fVar161 + auVar185._8_4_;
                            fVar137 = fVar166 + auVar185._12_4_;
                            auVar234._0_4_ = fVar81 * fVar132;
                            auVar234._4_4_ = fVar133 * fVar134;
                            auVar234._8_4_ = fVar135 * fVar136;
                            auVar234._12_4_ = fVar137 * fVar237;
                            auVar120 = vsubps_avx(auVar234,auVar98);
                            auVar224._0_4_ = fVar81 * fVar88;
                            auVar224._4_4_ = fVar133 * fVar89;
                            auVar224._8_4_ = fVar135 * fVar109;
                            auVar224._12_4_ = fVar137 * fVar52;
                            auVar124._0_4_ = fVar196 * fVar229;
                            auVar124._4_4_ = fVar198 * fVar206;
                            auVar124._8_4_ = fVar204 * fVar235;
                            auVar124._12_4_ = fVar207 * fVar236;
                            auVar141 = vsubps_avx(auVar124,auVar224);
                            auVar246._0_4_ =
                                 fVar181 * auVar48._0_4_ +
                                 auVar141._0_4_ * fVar53 + fVar241 * auVar120._0_4_;
                            auVar246._4_4_ =
                                 fVar182 * auVar48._4_4_ +
                                 auVar141._4_4_ * fVar77 + fVar242 * auVar120._4_4_;
                            auVar246._8_4_ =
                                 fVar183 * auVar48._8_4_ +
                                 auVar141._8_4_ * fVar80 + fVar243 * auVar120._8_4_;
                            auVar246._12_4_ =
                                 fVar184 * auVar48._12_4_ +
                                 auVar141._12_4_ * fVar83 + fVar247 * auVar120._12_4_;
                            auVar48 = vsubps_avx(auVar185,auVar220);
                            fVar229 = auVar185._0_4_ + auVar220._0_4_;
                            fVar206 = auVar185._4_4_ + auVar220._4_4_;
                            fVar235 = auVar185._8_4_ + auVar220._8_4_;
                            fVar236 = auVar185._12_4_ + auVar220._12_4_;
                            auVar120 = vsubps_avx(auVar121,auVar55);
                            fVar85 = auVar121._0_4_ + auVar55._0_4_;
                            fVar215 = auVar121._4_4_ + auVar55._4_4_;
                            fVar160 = auVar121._8_4_ + auVar55._8_4_;
                            fVar165 = auVar121._12_4_ + auVar55._12_4_;
                            auVar55 = vsubps_avx(auVar208,auVar140);
                            fVar219 = auVar208._0_4_ + auVar140._0_4_;
                            fVar226 = auVar208._4_4_ + auVar140._4_4_;
                            fVar227 = auVar208._8_4_ + auVar140._8_4_;
                            fVar228 = auVar208._12_4_ + auVar140._12_4_;
                            fVar81 = auVar55._0_4_;
                            auVar177._0_4_ = fVar85 * fVar81;
                            fVar133 = auVar55._4_4_;
                            auVar177._4_4_ = fVar215 * fVar133;
                            fVar135 = auVar55._8_4_;
                            auVar177._8_4_ = fVar160 * fVar135;
                            fVar137 = auVar55._12_4_;
                            auVar177._12_4_ = fVar165 * fVar137;
                            fVar79 = auVar120._0_4_;
                            auVar191._0_4_ = fVar79 * fVar219;
                            fVar139 = auVar120._4_4_;
                            auVar191._4_4_ = fVar139 * fVar226;
                            fVar163 = auVar120._8_4_;
                            auVar191._8_4_ = fVar163 * fVar227;
                            fVar110 = auVar120._12_4_;
                            auVar191._12_4_ = fVar110 * fVar228;
                            auVar55 = vsubps_avx(auVar191,auVar177);
                            fVar217 = auVar48._0_4_;
                            auVar152._0_4_ = fVar217 * fVar219;
                            fVar219 = auVar48._4_4_;
                            auVar152._4_4_ = fVar219 * fVar226;
                            fVar226 = auVar48._8_4_;
                            auVar152._8_4_ = fVar226 * fVar227;
                            fVar227 = auVar48._12_4_;
                            auVar152._12_4_ = fVar227 * fVar228;
                            auVar192._0_4_ = fVar229 * fVar81;
                            auVar192._4_4_ = fVar206 * fVar133;
                            auVar192._8_4_ = fVar235 * fVar135;
                            auVar192._12_4_ = fVar236 * fVar137;
                            auVar48 = vsubps_avx(auVar192,auVar152);
                            auVar65._0_4_ = fVar79 * fVar229;
                            auVar65._4_4_ = fVar139 * fVar206;
                            auVar65._8_4_ = fVar163 * fVar235;
                            auVar65._12_4_ = fVar110 * fVar236;
                            auVar99._0_4_ = fVar217 * fVar85;
                            auVar99._4_4_ = fVar219 * fVar215;
                            auVar99._8_4_ = fVar226 * fVar160;
                            auVar99._12_4_ = fVar227 * fVar165;
                            auVar140 = vsubps_avx(auVar99,auVar65);
                            auVar66._0_4_ =
                                 fVar181 * auVar55._0_4_ +
                                 auVar140._0_4_ * fVar53 + fVar241 * auVar48._0_4_;
                            auVar66._4_4_ =
                                 fVar182 * auVar55._4_4_ +
                                 auVar140._4_4_ * fVar77 + fVar242 * auVar48._4_4_;
                            auVar66._8_4_ =
                                 fVar183 * auVar55._8_4_ +
                                 auVar140._8_4_ * fVar80 + fVar243 * auVar48._8_4_;
                            auVar66._12_4_ =
                                 fVar184 * auVar55._12_4_ +
                                 auVar140._12_4_ * fVar83 + fVar247 * auVar48._12_4_;
                            auVar225._0_4_ =
                                 auVar66._0_4_ + (float)local_1a98._0_4_ + auVar246._0_4_;
                            auVar225._4_4_ =
                                 auVar66._4_4_ + (float)local_1a98._4_4_ + auVar246._4_4_;
                            auVar225._8_4_ = auVar66._8_4_ + fStack_1a90 + auVar246._8_4_;
                            auVar225._12_4_ = auVar66._12_4_ + fStack_1a8c + auVar246._12_4_;
                            auVar48 = vminps_avx(_local_1a98,auVar246);
                            auVar55 = vminps_avx(auVar48,auVar66);
                            auVar48 = vandps_avx(auVar225,auVar254);
                            auVar153._0_4_ = auVar48._0_4_ * 1.1920929e-07;
                            auVar153._4_4_ = auVar48._4_4_ * 1.1920929e-07;
                            auVar153._8_4_ = auVar48._8_4_ * 1.1920929e-07;
                            auVar153._12_4_ = auVar48._12_4_ * 1.1920929e-07;
                            uVar28 = CONCAT44(auVar153._4_4_,auVar153._0_4_);
                            auVar178._0_8_ = uVar28 ^ 0x8000000080000000;
                            auVar178._8_4_ = -auVar153._8_4_;
                            auVar178._12_4_ = -auVar153._12_4_;
                            auVar55 = vcmpps_avx(auVar55,auVar178,5);
                            auVar140 = vmaxps_avx(_local_1a98,auVar246);
                            auVar140 = vmaxps_avx(auVar140,auVar66);
                            auVar140 = vcmpps_avx(auVar140,auVar153,2);
                            auVar55 = vorps_avx(auVar55,auVar140);
                            auVar140 = local_1a58 & auVar55;
                            if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar140 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar140 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar140[0xf] < '\0') {
                              auVar67._0_4_ = fVar78 * fVar88;
                              auVar67._4_4_ = fVar84 * fVar89;
                              auVar67._8_4_ = fVar86 * fVar109;
                              auVar67._12_4_ = fVar87 * fVar52;
                              auVar100._0_4_ = fVar249 * fVar132;
                              auVar100._4_4_ = fVar250 * fVar134;
                              auVar100._8_4_ = fVar251 * fVar136;
                              auVar100._12_4_ = fVar167 * fVar237;
                              auVar141 = vsubps_avx(auVar100,auVar67);
                              auVar154._0_4_ = fVar132 * fVar79;
                              auVar154._4_4_ = fVar134 * fVar139;
                              auVar154._8_4_ = fVar136 * fVar163;
                              auVar154._12_4_ = fVar237 * fVar110;
                              auVar179._0_4_ = fVar88 * fVar81;
                              auVar179._4_4_ = fVar89 * fVar133;
                              auVar179._8_4_ = fVar109 * fVar135;
                              auVar179._12_4_ = fVar52 * fVar137;
                              auVar168 = vsubps_avx(auVar179,auVar154);
                              auVar140 = vandps_avx(auVar254,auVar67);
                              auVar120 = vandps_avx(auVar254,auVar154);
                              auVar140 = vcmpps_avx(auVar140,auVar120,1);
                              auVar141 = vblendvps_avx(auVar168,auVar141,auVar140);
                              auVar68._0_4_ = fVar196 * fVar81;
                              auVar68._4_4_ = fVar198 * fVar133;
                              auVar68._8_4_ = fVar204 * fVar135;
                              auVar68._12_4_ = fVar207 * fVar137;
                              auVar101._0_4_ = fVar196 * fVar78;
                              auVar101._4_4_ = fVar198 * fVar84;
                              auVar101._8_4_ = fVar204 * fVar86;
                              auVar101._12_4_ = fVar207 * fVar87;
                              auVar155._0_4_ = fVar213 * fVar132;
                              auVar155._4_4_ = fVar164 * fVar134;
                              auVar155._8_4_ = fVar138 * fVar136;
                              auVar155._12_4_ = fVar162 * fVar237;
                              auVar168 = vsubps_avx(auVar101,auVar155);
                              auVar180._0_4_ = fVar132 * fVar217;
                              auVar180._4_4_ = fVar134 * fVar219;
                              auVar180._8_4_ = fVar136 * fVar226;
                              auVar180._12_4_ = fVar237 * fVar227;
                              auVar185 = vsubps_avx(auVar180,auVar68);
                              auVar140 = vandps_avx(auVar254,auVar155);
                              auVar120 = vandps_avx(auVar254,auVar68);
                              auVar140 = vcmpps_avx(auVar140,auVar120,1);
                              auVar168 = vblendvps_avx(auVar185,auVar168,auVar140);
                              auVar69._0_4_ = fVar217 * fVar88;
                              auVar69._4_4_ = fVar219 * fVar89;
                              auVar69._8_4_ = fVar226 * fVar109;
                              auVar69._12_4_ = fVar227 * fVar52;
                              auVar102._0_4_ = fVar213 * fVar88;
                              auVar102._4_4_ = fVar164 * fVar89;
                              auVar102._8_4_ = fVar138 * fVar109;
                              auVar102._12_4_ = fVar162 * fVar52;
                              auVar125._0_4_ = fVar196 * fVar249;
                              auVar125._4_4_ = fVar198 * fVar250;
                              auVar125._8_4_ = fVar204 * fVar251;
                              auVar125._12_4_ = fVar207 * fVar167;
                              auVar46._0_4_ = fVar196 * fVar79;
                              auVar46._4_4_ = fVar198 * fVar139;
                              auVar46._8_4_ = fVar204 * fVar163;
                              auVar46._12_4_ = fVar207 * fVar110;
                              auVar185 = vsubps_avx(auVar102,auVar125);
                              auVar121 = vsubps_avx(auVar46,auVar69);
                              auVar140 = vandps_avx(auVar254,auVar125);
                              auVar120 = vandps_avx(auVar254,auVar69);
                              auVar140 = vcmpps_avx(auVar140,auVar120,1);
                              auVar185 = vblendvps_avx(auVar121,auVar185,auVar140);
                              local_1aa8._0_4_ = auVar18._0_4_;
                              local_1aa8._4_4_ = auVar18._4_4_;
                              fStack_1aa0 = auVar18._8_4_;
                              fVar78 = fVar181 * auVar141._0_4_ +
                                       auVar185._0_4_ * (float)local_1aa8._0_4_ +
                                       auVar168._0_4_ * fVar241;
                              fVar81 = fVar182 * auVar141._4_4_ +
                                       auVar185._4_4_ * (float)local_1aa8._4_4_ +
                                       auVar168._4_4_ * fVar242;
                              fVar84 = fVar183 * auVar141._8_4_ +
                                       auVar185._8_4_ * fStack_1aa0 + auVar168._8_4_ * fVar243;
                              fVar133 = fVar184 * auVar141._12_4_ +
                                        auVar185._12_4_ * fVar83 + auVar168._12_4_ * fVar247;
                              auVar70._0_4_ = fVar78 + fVar78;
                              auVar70._4_4_ = fVar81 + fVar81;
                              auVar70._8_4_ = fVar84 + fVar84;
                              auVar70._12_4_ = fVar133 + fVar133;
                              fVar78 = auVar141._0_4_ * fVar76 +
                                       auVar185._0_4_ * fVar41 + auVar168._0_4_ * fVar195;
                              fVar81 = auVar141._4_4_ * fVar82 +
                                       auVar185._4_4_ * fVar50 + auVar168._4_4_ * fVar197;
                              fVar84 = auVar141._8_4_ * fVar161 +
                                       auVar185._8_4_ * fVar51 + auVar168._8_4_ * fVar203;
                              fVar133 = auVar141._12_4_ * fVar166 +
                                        auVar185._12_4_ * fVar75 + auVar168._12_4_ * fVar205;
                              auVar140 = vrcpps_avx(auVar70);
                              fVar41 = auVar140._0_4_;
                              auVar126._0_4_ = auVar70._0_4_ * fVar41;
                              fVar50 = auVar140._4_4_;
                              auVar126._4_4_ = auVar70._4_4_ * fVar50;
                              fVar51 = auVar140._8_4_;
                              auVar126._8_4_ = auVar70._8_4_ * fVar51;
                              fVar75 = auVar140._12_4_;
                              auVar126._12_4_ = auVar70._12_4_ * fVar75;
                              auVar156._8_4_ = 0x3f800000;
                              auVar156._0_8_ = &DAT_3f8000003f800000;
                              auVar156._12_4_ = 0x3f800000;
                              auVar140 = vsubps_avx(auVar156,auVar126);
                              auVar47._0_4_ = (fVar78 + fVar78) * (fVar41 + fVar41 * auVar140._0_4_)
                              ;
                              auVar47._4_4_ = (fVar81 + fVar81) * (fVar50 + fVar50 * auVar140._4_4_)
                              ;
                              auVar47._8_4_ = (fVar84 + fVar84) * (fVar51 + fVar51 * auVar140._8_4_)
                              ;
                              auVar47._12_4_ =
                                   (fVar133 + fVar133) * (fVar75 + fVar75 * auVar140._12_4_);
                              auVar140 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar120 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar47,2);
                              auVar121 = vcmpps_avx(auVar47,auVar140,2);
                              auVar120 = vandps_avx(auVar120,auVar121);
                              auVar121 = vcmpps_avx(auVar70,ZEXT816(0) << 0x20,4);
                              auVar120 = vandps_avx(auVar121,auVar120);
                              auVar55 = vandps_avx(auVar55,local_1a58);
                              auVar120 = vpslld_avx(auVar120,0x1f);
                              auVar121 = vpsrad_avx(auVar120,0x1f);
                              auVar120 = auVar55 & auVar121;
                              if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar120[0xf] < '\0') {
                                auVar55 = vandps_avx(auVar121,auVar55);
                                uVar4 = *(uint *)(lVar35 + 0x40 + uVar37 * 4);
                                pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                                uVar23 = pGVar6->mask;
                                auVar103._4_4_ = uVar23;
                                auVar103._0_4_ = uVar23;
                                auVar103._8_4_ = uVar23;
                                auVar103._12_4_ = uVar23;
                                auVar120 = vandps_avx(auVar103,*(undefined1 (*) [16])(ray + 0x90));
                                auVar120 = vpcmpeqd_avx(auVar120,ZEXT816(0) << 0x20);
                                auVar121 = auVar55 & ~auVar120;
                                if ((((auVar121 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar121 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar121 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar121[0xf] < '\0') {
                                  aVar72 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                           vandnps_avx(auVar120,auVar55);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar55 = vrcpps_avx(auVar225);
                                    fVar41 = auVar55._0_4_;
                                    auVar129._0_4_ = auVar225._0_4_ * fVar41;
                                    fVar50 = auVar55._4_4_;
                                    auVar129._4_4_ = auVar225._4_4_ * fVar50;
                                    fVar51 = auVar55._8_4_;
                                    auVar129._8_4_ = auVar225._8_4_ * fVar51;
                                    fVar75 = auVar55._12_4_;
                                    auVar129._12_4_ = auVar225._12_4_ * fVar75;
                                    auVar194._8_4_ = 0x3f800000;
                                    auVar194._0_8_ = &DAT_3f8000003f800000;
                                    auVar194._12_4_ = 0x3f800000;
                                    auVar55 = vsubps_avx(auVar194,auVar129);
                                    auVar105._0_4_ = fVar41 + fVar41 * auVar55._0_4_;
                                    auVar105._4_4_ = fVar50 + fVar50 * auVar55._4_4_;
                                    auVar105._8_4_ = fVar51 + fVar51 * auVar55._8_4_;
                                    auVar105._12_4_ = fVar75 + fVar75 * auVar55._12_4_;
                                    auVar130._8_4_ = 0x219392ef;
                                    auVar130._0_8_ = 0x219392ef219392ef;
                                    auVar130._12_4_ = 0x219392ef;
                                    auVar48 = vcmpps_avx(auVar48,auVar130,5);
                                    auVar48 = vandps_avx(auVar48,auVar105);
                                    auVar131._0_4_ = auVar48._0_4_ * (float)local_1a98._0_4_;
                                    auVar131._4_4_ = auVar48._4_4_ * (float)local_1a98._4_4_;
                                    auVar131._8_4_ = auVar48._8_4_ * fStack_1a90;
                                    auVar131._12_4_ = auVar48._12_4_ * fStack_1a8c;
                                    auVar55 = vminps_avx(auVar131,auVar194);
                                    auVar106._0_4_ = auVar48._0_4_ * auVar246._0_4_;
                                    auVar106._4_4_ = auVar48._4_4_ * auVar246._4_4_;
                                    auVar106._8_4_ = auVar48._8_4_ * auVar246._8_4_;
                                    auVar106._12_4_ = auVar48._12_4_ * auVar246._12_4_;
                                    auVar48 = vminps_avx(auVar106,auVar194);
                                    auVar120 = vsubps_avx(auVar194,auVar55);
                                    auVar121 = vsubps_avx(auVar194,auVar48);
                                    vblendvps_avx(auVar55,auVar120,auVar9);
                                    auVar48 = vblendvps_avx(auVar48,auVar121,auVar9);
                                    vpshufd_avx(ZEXT416(uVar4),0);
                                    vpshufd_avx(ZEXT416(*(uint *)(lVar35 + 0x50 + uVar37 * 4)),0);
                                    p0.field_0._0_16_ = auVar141;
                                    p0.field_0._16_16_ = auVar168;
                                    p0.field_0._32_16_ = auVar185;
                                    vcmpps_avx(ZEXT1632(auVar48),ZEXT1632(auVar48),0xf);
                                    auVar48 = vblendvps_avx(auVar140,auVar47,
                                                            (undefined1  [16])aVar72);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar48;
                                    itime.field_0 = aVar72;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar6->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar6->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&p1);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar48 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                      auVar48 = auVar48 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var8 = context->args->filter;
                                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var8)((RTCFilterFunctionNArguments *)&p1);
                                      }
                                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                             (undefined1  [16])itime.field_0);
                                      auVar48 = auVar55 ^ _DAT_01febe20;
                                      auVar107._8_4_ = 0xff800000;
                                      auVar107._0_8_ = 0xff800000ff800000;
                                      auVar107._12_4_ = 0xff800000;
                                      auVar55 = vblendvps_avx(auVar107,*(undefined1 (*) [16])
                                                                        (p1.field_0._24_8_ + 0x80),
                                                              auVar55);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar55;
                                    }
                                    auVar48 = vpslld_avx(auVar48,0x1f);
                                    aVar72 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                             vpsrad_avx(auVar48,0x1f);
                                    auVar48 = vblendvps_avx(auVar140,*(undefined1 (*) [16])pRVar1,
                                                            auVar48);
                                    *(undefined1 (*) [16])pRVar1 = auVar48;
                                  }
                                  local_1a58 = vpandn_avx((undefined1  [16])aVar72,local_1a58);
                                }
                              }
                            }
                            bVar40 = (((local_1a58 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0 ||
                                      (local_1a58 >> 0x3f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                     (local_1a58 >> 0x5f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) || local_1a58[0xf] < '\0';
                          }
                          if ((!bVar40) || (bVar40 = 2 < uVar37, uVar37 = uVar37 + 1, bVar40))
                          break;
                        }
                        auVar48 = vandps_avx(local_1a58,auVar146);
                        auVar146 = auVar146 & local_1a58;
                      } while (((((auVar146 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar146 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar146 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar146[0xf] < '\0') &&
                              (uVar25 = uVar25 + 1, auVar146 = auVar48, uVar25 < uVar38 - 8));
                      auVar55 = vpcmpeqd_avx(local_1a58,local_1a58);
                      aVar49._0_4_ = auVar48._0_4_ ^ auVar55._0_4_;
                      aVar49._4_4_ = auVar48._4_4_ ^ auVar55._4_4_;
                      aVar49._8_4_ = auVar48._8_4_ ^ auVar55._8_4_;
                      aVar49._12_4_ = auVar48._12_4_ ^ auVar55._12_4_;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar49,(undefined1  [16])terminated.field_0);
                    auVar55 = auVar55 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar55[0xf]) goto LAB_0032b0ab;
                    auVar108._8_4_ = 0xff800000;
                    auVar108._0_8_ = 0xff800000ff800000;
                    auVar108._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar108,
                                       (undefined1  [16])terminated.field_0);
                    iVar24 = 0;
                    break;
                  }
                  goto LAB_0032b0bc;
                }
                uVar25 = root.ptr & 0xfffffffffffffff0;
                auVar48 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar48,6);
                auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar38 = 0;
                sVar29 = 8;
                do {
                  sVar5 = *(size_t *)(uVar25 + uVar38 * 8);
                  root.ptr = sVar29;
                  if (sVar5 != 8) {
                    aVar54 = auVar74._0_16_;
                    fVar41 = *(float *)(uVar25 + 0x80 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x20 + uVar38 * 4);
                    auVar55 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar51 = auVar55._0_4_;
                    fVar75 = auVar55._4_4_;
                    fVar78 = auVar55._8_4_;
                    fVar81 = auVar55._12_4_;
                    auVar90._0_4_ = fVar51 * fVar41 + fVar50;
                    auVar90._4_4_ = fVar75 * fVar41 + fVar50;
                    auVar90._8_4_ = fVar78 * fVar41 + fVar50;
                    auVar90._12_4_ = fVar81 * fVar41 + fVar50;
                    fVar41 = *(float *)(uVar25 + 0xa0 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x40 + uVar38 * 4);
                    auVar111._0_4_ = fVar51 * fVar41 + fVar50;
                    auVar111._4_4_ = fVar75 * fVar41 + fVar50;
                    auVar111._8_4_ = fVar78 * fVar41 + fVar50;
                    auVar111._12_4_ = fVar81 * fVar41 + fVar50;
                    fVar41 = *(float *)(uVar25 + 0xc0 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x60 + uVar38 * 4);
                    auVar142._0_4_ = fVar51 * fVar41 + fVar50;
                    auVar142._4_4_ = fVar75 * fVar41 + fVar50;
                    auVar142._8_4_ = fVar78 * fVar41 + fVar50;
                    auVar142._12_4_ = fVar81 * fVar41 + fVar50;
                    fVar41 = *(float *)(uVar25 + 0x90 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x30 + uVar38 * 4);
                    auVar169._0_4_ = fVar51 * fVar41 + fVar50;
                    auVar169._4_4_ = fVar75 * fVar41 + fVar50;
                    auVar169._8_4_ = fVar78 * fVar41 + fVar50;
                    auVar169._12_4_ = fVar81 * fVar41 + fVar50;
                    fVar41 = *(float *)(uVar25 + 0xb0 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x50 + uVar38 * 4);
                    auVar186._0_4_ = fVar51 * fVar41 + fVar50;
                    auVar186._4_4_ = fVar75 * fVar41 + fVar50;
                    auVar186._8_4_ = fVar78 * fVar41 + fVar50;
                    auVar186._12_4_ = fVar81 * fVar41 + fVar50;
                    fVar41 = *(float *)(uVar25 + 0xd0 + uVar38 * 4);
                    fVar50 = *(float *)(uVar25 + 0x70 + uVar38 * 4);
                    auVar199._0_4_ = fVar50 + fVar51 * fVar41;
                    auVar199._4_4_ = fVar50 + fVar75 * fVar41;
                    auVar199._8_4_ = fVar50 + fVar78 * fVar41;
                    auVar199._12_4_ = fVar50 + fVar81 * fVar41;
                    auVar14._8_8_ = tray.org.field_0._8_8_;
                    auVar14._0_8_ = tray.org.field_0._0_8_;
                    auVar15._8_8_ = tray.org.field_0._24_8_;
                    auVar15._0_8_ = tray.org.field_0._16_8_;
                    auVar16._8_8_ = tray.org.field_0._40_8_;
                    auVar16._0_8_ = tray.org.field_0._32_8_;
                    auVar140 = vsubps_avx(auVar90,auVar14);
                    auVar244._0_4_ = tray.rdir.field_0._0_4_ * auVar140._0_4_;
                    auVar244._4_4_ = tray.rdir.field_0._4_4_ * auVar140._4_4_;
                    auVar244._8_4_ = tray.rdir.field_0._8_4_ * auVar140._8_4_;
                    auVar244._12_4_ = tray.rdir.field_0._12_4_ * auVar140._12_4_;
                    auVar140 = vsubps_avx(auVar111,auVar15);
                    auVar248._0_4_ = auVar140._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar248._4_4_ = auVar140._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar248._8_4_ = auVar140._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar248._12_4_ = auVar140._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar140 = vsubps_avx(auVar142,auVar16);
                    auVar252._0_4_ = auVar140._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar252._4_4_ = auVar140._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar252._8_4_ = auVar140._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar252._12_4_ = auVar140._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar140 = vsubps_avx(auVar169,auVar14);
                    auVar170._0_4_ = tray.rdir.field_0._0_4_ * auVar140._0_4_;
                    auVar170._4_4_ = tray.rdir.field_0._4_4_ * auVar140._4_4_;
                    auVar170._8_4_ = tray.rdir.field_0._8_4_ * auVar140._8_4_;
                    auVar170._12_4_ = tray.rdir.field_0._12_4_ * auVar140._12_4_;
                    auVar140 = vsubps_avx(auVar186,auVar15);
                    auVar112._0_4_ = auVar140._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar112._4_4_ = auVar140._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar112._8_4_ = auVar140._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar112._12_4_ = auVar140._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar140 = vsubps_avx(auVar199,auVar16);
                    auVar143._0_4_ = auVar140._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar143._4_4_ = auVar140._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar143._8_4_ = auVar140._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar143._12_4_ = auVar140._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar140 = vpminsd_avx(auVar244,auVar170);
                    auVar120 = vpminsd_avx(auVar248,auVar112);
                    auVar140 = vpmaxsd_avx(auVar140,auVar120);
                    auVar120 = vpminsd_avx(auVar252,auVar143);
                    auVar140 = vpmaxsd_avx(auVar140,auVar120);
                    auVar91._0_4_ = auVar140._0_4_ * 0.99999964;
                    auVar91._4_4_ = auVar140._4_4_ * 0.99999964;
                    auVar91._8_4_ = auVar140._8_4_ * 0.99999964;
                    auVar91._12_4_ = auVar140._12_4_ * 0.99999964;
                    auVar140 = vpmaxsd_avx(auVar244,auVar170);
                    auVar120 = vpmaxsd_avx(auVar248,auVar112);
                    auVar120 = vpminsd_avx(auVar140,auVar120);
                    auVar140 = vpmaxsd_avx(auVar252,auVar143);
                    auVar120 = vpminsd_avx(auVar120,auVar140);
                    auVar140 = vpmaxsd_avx(auVar91,(undefined1  [16])tray.tnear.field_0);
                    auVar144._0_4_ = auVar120._0_4_ * 1.0000004;
                    auVar144._4_4_ = auVar120._4_4_ * 1.0000004;
                    auVar144._8_4_ = auVar120._8_4_ * 1.0000004;
                    auVar144._12_4_ = auVar120._12_4_ * 1.0000004;
                    auVar120 = vpminsd_avx(auVar144,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar23 & 7) == 6) {
                      auVar140 = vcmpps_avx(auVar140,auVar120,2);
                      uVar27 = *(undefined4 *)(uVar25 + 0xe0 + uVar38 * 4);
                      auVar145._4_4_ = uVar27;
                      auVar145._0_4_ = uVar27;
                      auVar145._8_4_ = uVar27;
                      auVar145._12_4_ = uVar27;
                      auVar120 = vcmpps_avx(auVar145,auVar55,2);
                      uVar27 = *(undefined4 *)(uVar25 + 0xf0 + uVar38 * 4);
                      auVar171._4_4_ = uVar27;
                      auVar171._0_4_ = uVar27;
                      auVar171._8_4_ = uVar27;
                      auVar171._12_4_ = uVar27;
                      auVar55 = vcmpps_avx(auVar55,auVar171,1);
                      auVar55 = vandps_avx(auVar120,auVar55);
                      auVar55 = vandps_avx(auVar55,auVar140);
                    }
                    else {
                      auVar55 = vcmpps_avx(auVar140,auVar120,2);
                    }
                    auVar55 = vandps_avx(auVar55,auVar48);
                    auVar55 = vpslld_avx(auVar55,0x1f);
                    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar55[0xf]) {
                      auVar74 = ZEXT1664((undefined1  [16])aVar54);
                    }
                    else {
                      auVar113._8_4_ = 0x7f800000;
                      auVar113._0_8_ = 0x7f8000007f800000;
                      auVar113._12_4_ = 0x7f800000;
                      auVar55 = vblendvps_avx(auVar113,auVar91,auVar55);
                      auVar74 = ZEXT1664(auVar55);
                      root.ptr = sVar5;
                      if (sVar29 != 8) {
                        pNVar39->ptr = sVar29;
                        pNVar39 = pNVar39 + 1;
                        *paVar36 = aVar54;
                        paVar36 = paVar36 + 1;
                      }
                    }
                  }
                } while ((sVar5 != 8) &&
                        (bVar40 = uVar38 < 3, uVar38 = uVar38 + 1, sVar29 = root.ptr, bVar40));
                iVar24 = 0;
                if (root.ptr == 8) {
LAB_00329b84:
                  bVar40 = false;
                  iVar24 = 4;
                }
                else {
                  auVar48 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar74._0_16_,6);
                  uVar27 = vmovmskps_avx(auVar48);
                  bVar40 = true;
                  if ((uint)POPCOUNT(uVar27) <= uVar30) {
                    pNVar39->ptr = root.ptr;
                    pNVar39 = pNVar39 + 1;
                    *paVar36 = auVar74._0_16_;
                    paVar36 = paVar36 + 1;
                    goto LAB_00329b84;
                  }
                }
              } while (bVar40);
            }
          }
        }
      } while (iVar24 != 3);
      auVar9 = vandps_avx(auVar73,(undefined1  [16])terminated.field_0);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar73);
      *(undefined1 (*) [16])pRVar1 = auVar9;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }